

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_time.cc
# Opt level: O0

tm * OPENSSL_gmtime(time_t *time,tm *out_tm)

{
  int iVar1;
  int64_t posix_time;
  tm *out_tm_local;
  time_t *time_local;
  
  iVar1 = OPENSSL_posix_to_tm(*time,out_tm);
  time_local = (time_t *)out_tm;
  if (iVar1 == 0) {
    time_local = (time_t *)0x0;
  }
  return (tm *)time_local;
}

Assistant:

struct tm *OPENSSL_gmtime(const time_t *time, struct tm *out_tm) {
  static_assert(
      sizeof(time_t) == sizeof(int32_t) || sizeof(time_t) == sizeof(int64_t),
      "time_t is broken");
  int64_t posix_time = *time;
  if (!OPENSSL_posix_to_tm(posix_time, out_tm)) {
    return NULL;
  }
  return out_tm;
}